

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  uint uVar1;
  FileStream *this;
  Engine *this_00;
  IGlobalFunction *globalFunction;
  Object **args;
  ObjectInt *this_01;
  string local_60;
  string local_40;
  
  this = (FileStream *)operator_new(0x10);
  FileStream::FileStream(this,"test.script");
  this_00 = (Engine *)operator_new(0x70);
  Engine::Engine(this_00);
  Engine::loadCurrentScript(this_00,(Stream *)this);
  operator_delete(this);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"test","");
  uVar1 = Engine::getGlobalFunctionNameByString(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  globalFunction = (IGlobalFunction *)operator_new(8);
  globalFunction->_vptr_IGlobalFunction = (_func_int **)&PTR_execute_0010b810;
  Engine::setGlobalFunction(this_00,uVar1,globalFunction);
  Engine::executeCurrentScript(this_00);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"myTestFunction","");
  uVar1 = Engine::getLocalFunctionNameByString(this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  args = (Object **)operator_new__(8);
  this_01 = (ObjectInt *)operator_new(0x10);
  ObjectInt::ObjectInt(this_01,0x18894);
  *args = (Object *)this_01;
  Engine::executeLocalFunction(this_00,uVar1,args,1);
  Engine::~Engine(this_00);
  operator_delete(this_00);
  return 0;
}

Assistant:

int main() {
	Stream* stream = new FileStream("test.script");
	Engine* engine = new Engine();
	
	engine->loadCurrentScript(stream);
	delete stream;
	
	unsigned int testFunctionName = engine->getGlobalFunctionNameByString("test");
	if (testFunctionName == Engine::CANT_FIND) {
		//do something
	}
	engine->setGlobalFunction(testFunctionName, new TestFunction());
	
	engine->executeCurrentScript();
	unsigned int myTestFunctionName = engine->getLocalFunctionNameByString("myTestFunction");
	
	unsigned int argc = 1;
	Object** args = new Object*[argc];
	args[0] = new ObjectInt(100500);
	engine->executeLocalFunction(myTestFunctionName, args, argc);
	
	delete engine;
	return 0;
}